

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O3

void __thiscall create::Packet::setDataToValidate(Packet *this,uint16_t *tmp)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->tmpDataMutex);
  if (iVar1 == 0) {
    this->tmpData = *tmp;
    pthread_mutex_unlock((pthread_mutex_t *)&this->tmpDataMutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void Packet::setDataToValidate(const uint16_t& tmp) {
    std::lock_guard<std::mutex> lock(tmpDataMutex);
    tmpData = tmp;
  }